

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

gs_val_t *
gs_c_fn_print(gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_val_t *vals,int num_vals)

{
  ulong uVar1;
  gs_val_t in_stack_00000000;
  
  if (0 < num_vals) {
    uVar1 = (ulong)(uint)num_vals;
    do {
      gs_c_fn_print_val(in_stack_00000000);
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  putchar(10);
  __return_storage_ptr__->type = GS_VAL_VOID;
  __return_storage_ptr__->is_return = false;
  return __return_storage_ptr__;
}

Assistant:

static gs_val_t gs_c_fn_print(gs_eval_t *eval, gs_val_t *vals, int num_vals) {
    GOLF_UNUSED(eval);

    for (int i = 0; i < num_vals; i++) {
        gs_c_fn_print_val(vals[i]);
    }
    printf("\n");
    return gs_val_void();
}